

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thermo.cpp
# Opt level: O0

Mat3x3d * __thiscall OpenMD::Thermo::getBoundingBox(Thermo *this)

{
  SnapshotManager *this_00;
  double *pdVar1;
  double *__b;
  undefined8 *in_RSI;
  Mat3x3d *in_RDI;
  RigidBody *in_stack_00000020;
  int i_2;
  Mat3x3d bBox;
  int i_1;
  int index;
  Vector3d bMin;
  Vector3d bMax;
  Vector3d pos;
  Atom *atom;
  RigidBody *rb;
  Molecule *mol;
  AtomIterator ai;
  RigidBodyIterator ri;
  MoleculeIterator i;
  Snapshot *snap;
  Snapshot *in_stack_fffffffffffffe88;
  SquareMatrix3<double> *in_stack_fffffffffffffe90;
  StuntDouble *in_stack_fffffffffffffe98;
  double dVar2;
  iterator *in_stack_fffffffffffffea8;
  SimInfo *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffef8;
  uint i_00;
  Snapshot *in_stack_ffffffffffffff00;
  uint local_b4;
  int local_94;
  Vector<double,_3U> local_90;
  Vector<double,_3U> local_78;
  Vector<double,_3U> local_60;
  Atom *local_48;
  RigidBody *local_40;
  Molecule *local_38;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  local_30;
  __normal_iterator<OpenMD::RigidBody_**,_std::vector<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>_>
  local_28;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_20;
  Snapshot *local_18;
  
  this_00 = SimInfo::getSnapshotManager((SimInfo *)*in_RSI);
  local_18 = SnapshotManager::getCurrentSnapshot(this_00);
  if ((local_18->hasBoundingBox & 1U) == 0) {
    std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(&local_20);
    __gnu_cxx::
    __normal_iterator<OpenMD::RigidBody_**,_std::vector<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>_>
    ::__normal_iterator(&local_28);
    __gnu_cxx::
    __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
    ::__normal_iterator(&local_30);
    Vector3<double>::Vector3((Vector3<double> *)0x1b3e52);
    Vector3<double>::Vector3((Vector3<double> *)0x1b3e5f);
    Vector3<double>::Vector3((Vector3<double> *)0x1b3e6c);
    local_94 = 0;
    local_38 = SimInfo::beginMolecule
                         (in_stack_fffffffffffffeb0,(MoleculeIterator *)in_stack_fffffffffffffea8);
    while (local_38 != (Molecule *)0x0) {
      local_40 = Molecule::beginRigidBody
                           ((Molecule *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      while (local_40 != (RigidBody *)0x0) {
        RigidBody::updateAtoms(in_stack_00000020);
        local_40 = Molecule::nextRigidBody
                             ((Molecule *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      }
      local_48 = Molecule::beginAtom((Molecule *)in_stack_fffffffffffffeb0,
                                     (iterator *)in_stack_fffffffffffffea8);
      while (local_48 != (Atom *)0x0) {
        StuntDouble::getPos(in_stack_fffffffffffffe98);
        Vector3<double>::operator=
                  ((Vector3<double> *)in_stack_fffffffffffffe90,
                   (Vector3<double> *)in_stack_fffffffffffffe88);
        if (local_94 == 0) {
          Vector3<double>::operator=
                    ((Vector3<double> *)in_stack_fffffffffffffe90,
                     (Vector3<double> *)in_stack_fffffffffffffe88);
          Vector3<double>::operator=
                    ((Vector3<double> *)in_stack_fffffffffffffe90,
                     (Vector3<double> *)in_stack_fffffffffffffe88);
        }
        else {
          for (local_b4 = 0; (int)local_b4 < 3; local_b4 = local_b4 + 1) {
            in_stack_fffffffffffffeb0 =
                 (SimInfo *)Vector<double,_3U>::operator[](&local_78,local_b4);
            pdVar1 = Vector<double,_3U>::operator[](&local_60,local_b4);
            pdVar1 = std::max<double>((double *)in_stack_fffffffffffffeb0,pdVar1);
            dVar2 = *pdVar1;
            pdVar1 = Vector<double,_3U>::operator[](&local_78,local_b4);
            *pdVar1 = dVar2;
            pdVar1 = Vector<double,_3U>::operator[](&local_90,local_b4);
            __b = Vector<double,_3U>::operator[](&local_60,local_b4);
            pdVar1 = std::min<double>(pdVar1,__b);
            dVar2 = *pdVar1;
            pdVar1 = Vector<double,_3U>::operator[](&local_90,local_b4);
            *pdVar1 = dVar2;
          }
        }
        local_94 = local_94 + 1;
        local_48 = Molecule::nextAtom((Molecule *)in_stack_fffffffffffffeb0,
                                      (iterator *)in_stack_fffffffffffffea8);
      }
      local_38 = SimInfo::nextMolecule
                           (in_stack_fffffffffffffeb0,(MoleculeIterator *)in_stack_fffffffffffffea8)
      ;
    }
    SquareMatrix3<double>::SquareMatrix3
              (in_stack_fffffffffffffe90,(double)in_stack_fffffffffffffe88);
    for (i_00 = 0; (int)i_00 < 3; i_00 = i_00 + 1) {
      pdVar1 = Vector<double,_3U>::operator[](&local_78,i_00);
      dVar2 = *pdVar1;
      pdVar1 = Vector<double,_3U>::operator[](&local_90,i_00);
      in_stack_fffffffffffffe88 = (Snapshot *)(dVar2 - *pdVar1);
      pdVar1 = RectMatrix<double,_3U,_3U>::operator()
                         ((RectMatrix<double,_3U,_3U> *)&stack0xffffffffffffff00,i_00,i_00);
      *pdVar1 = (double)in_stack_fffffffffffffe88;
    }
    Snapshot::setBoundingBox
              (in_stack_ffffffffffffff00,(Mat3x3d *)CONCAT44(i_00,in_stack_fffffffffffffef8));
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x1b41b6);
  }
  Snapshot::getBoundingBox(in_stack_fffffffffffffe88);
  return in_RDI;
}

Assistant:

Mat3x3d Thermo::getBoundingBox() {
    Snapshot* snap = info_->getSnapshotManager()->getCurrentSnapshot();

    if (!(snap->hasBoundingBox)) {
      SimInfo::MoleculeIterator i;
      Molecule::RigidBodyIterator ri;
      Molecule::AtomIterator ai;
      Molecule* mol;
      RigidBody* rb;
      Atom* atom;
      Vector3d pos, bMax, bMin;
      int index = 0;

      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        // change the positions of atoms which belong to the rigidbodies
        for (rb = mol->beginRigidBody(ri); rb != NULL;
             rb = mol->nextRigidBody(ri)) {
          rb->updateAtoms();
        }

        for (atom = mol->beginAtom(ai); atom != NULL;
             atom = mol->nextAtom(ai)) {
          pos = atom->getPos();

          if (index == 0) {
            bMax = pos;
            bMin = pos;
          } else {
            for (int i = 0; i < 3; i++) {
              bMax[i] = max(bMax[i], pos[i]);
              bMin[i] = min(bMin[i], pos[i]);
            }
          }
          index++;
        }
      }

#ifdef IS_MPI
      MPI_Allreduce(MPI_IN_PLACE, &bMax[0], 3, MPI_REALTYPE, MPI_MAX,
                    MPI_COMM_WORLD);

      MPI_Allreduce(MPI_IN_PLACE, &bMin[0], 3, MPI_REALTYPE, MPI_MIN,
                    MPI_COMM_WORLD);
#endif
      Mat3x3d bBox = Mat3x3d(0.0);
      for (int i = 0; i < 3; i++) {
        bBox(i, i) = bMax[i] - bMin[i];
      }
      snap->setBoundingBox(bBox);
    }

    return snap->getBoundingBox();
  }